

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  CURLcode CVar1;
  size_t local_50;
  _Bool local_41;
  size_t sStack_40;
  _Bool eos;
  size_t nread;
  anon_union_280_8_fcbf97e8_for_proto *paStack_30;
  CURLcode result;
  smb_conn *smbc;
  connectdata *conn;
  void **msg_local;
  Curl_easy *data_local;
  
  smbc = (smb_conn *)data->conn;
  paStack_30 = &((connectdata *)smbc)->proto;
  *msg = (void *)0x0;
  conn = (connectdata *)msg;
  msg_local = (void **)data;
  if (((((connectdata *)smbc)->proto).ftpc.pp.sendbuf.allc == 0) &&
     ((((connectdata *)smbc)->proto).ftpc.pp.sendbuf.leng != 0)) {
    if ((((connectdata *)smbc)->proto).ftpc.pp.sendbuf.leng < 0x9001) {
      local_50 = (((connectdata *)smbc)->proto).ftpc.pp.sendbuf.leng;
    }
    else {
      local_50 = 0x9000;
    }
    sStack_40 = local_50;
    nread._4_4_ = Curl_client_read(data,(((connectdata *)smbc)->proto).smbc.send_buf,local_50,
                                   &stack0xffffffffffffffc0,&local_41);
    if ((nread._4_4_ != CURLE_OK) && (nread._4_4_ != CURLE_AGAIN)) {
      return nread._4_4_;
    }
    if (sStack_40 == 0) {
      return CURLE_OK;
    }
    (paStack_30->ftpc).pp.sendbuf.leng = (paStack_30->ftpc).pp.sendbuf.leng - sStack_40;
    (paStack_30->ftpc).pp.sendbuf.allc = sStack_40;
    (paStack_30->ftpc).pp.sendbuf.toobig = 0;
  }
  if ((paStack_30->ftpc).pp.sendbuf.allc != 0) {
    CVar1 = smb_flush((Curl_easy *)msg_local);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    nread._4_4_ = CURLE_OK;
  }
  if (((paStack_30->ftpc).pp.sendbuf.allc == 0) && ((paStack_30->ftpc).pp.sendbuf.leng == 0)) {
    data_local._4_4_ = smb_recv_message((Curl_easy *)msg_local,(void **)conn);
  }
  else {
    data_local._4_4_ = CURLE_AGAIN;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)MAX_MESSAGE_SIZE ?
      (size_t)MAX_MESSAGE_SIZE : smbc->upload_size;
    bool eos;

    result = Curl_client_read(data, smbc->send_buf, nread, &nread, &eos);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}